

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O3

void __thiscall DiskGen::Write(DiskGen *this,uchar byte,bool bSync)

{
  ushort uVar1;
  undefined3 in_register_00000031;
  
  this->read_ = false;
  if (CONCAT31(in_register_00000031,byte) != 0xa1 || !bSync) {
    if (byte != 0xc2 || !bSync) {
      this->sync_write_ = false;
      uVar1 = (ushort)byte;
    }
    else {
      this->sync_write_ = true;
      uVar1 = 0x5224;
    }
  }
  else {
    this->sync_write_ = true;
    uVar1 = 0x4489;
  }
  this->byte_to_write_ = uVar1;
  this->write_bit_ = 0;
  return;
}

Assistant:

void DiskGen::Write(unsigned char byte, bool bSync)
{
   read_ = false;

   // Convert to MFM Sync bytes
   if (bSync && byte == 0xA1)
   {
      sync_write_ = true;
      byte_to_write_ = sync_seq_short1;
   }
   else if (bSync && byte == 0xC2)
   {
      sync_write_ = true;
      byte_to_write_ = sync_seq_short2;
   }
   else
   {
      sync_write_ = false;
      byte_to_write_ = byte;
   }

   //LOGB(byte);

   write_bit_ = 0;
}